

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Sintatico::saltBlank(Sintatico *this)

{
  while (((uint)this->tok < 0x18 && ((0x980000U >> (this->tok & 0x1fU) & 1) != 0))) {
    avancar(this);
  }
  return;
}

Assistant:

void Sintatico::saltBlank() {
  while(tok == BARRAN || tok == WHITE || tok == TAB)
    avancar();
}